

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::IdentityGeometryShaderCase::iterate
          (IdentityGeometryShaderCase *this)

{
  char *pcVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  ProgramSources *pPVar10;
  TestError *pTVar11;
  Vector<int,_3> local_6dc;
  Vector<unsigned_int,_4> local_6d0;
  ConstPixelBufferAccess local_6c0;
  ConstPixelBufferAccess local_698;
  undefined1 local_66a;
  allocator<char> local_669;
  string local_668;
  undefined1 local_642;
  allocator<char> local_641;
  string local_640;
  undefined1 local_61a;
  allocator<char> local_619;
  string local_618;
  int local_5f4;
  int local_5f0;
  int outerTessellationLoc;
  int innerTessellationLoc;
  int posLocation;
  VertexArray vao;
  ShaderProgram program;
  ShaderSource local_4e0;
  string local_4b8;
  ShaderSource local_498;
  string local_470;
  ShaderSource local_450;
  string local_428;
  ShaderSource local_408;
  string local_3e0;
  ShaderSource local_3c0;
  undefined1 local_398 [8];
  ProgramSources sources;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  ScopedLogSection local_278;
  ScopedLogSection section;
  undefined1 local_268 [4];
  int renderNdx;
  char *local_e8;
  anon_struct_64_4_0b5d5edf renderTargets [2];
  undefined1 local_50 [8];
  Surface resultWithoutGeometry;
  Surface resultWithGeometry;
  Functions *gl;
  float outerTessellationLevel;
  float innerTessellationLevel;
  IdentityGeometryShaderCase *this_local;
  long lVar7;
  
  gl._4_4_ = 0x41600000;
  gl._0_4_ = 0x41600000;
  _outerTessellationLevel = this;
  pRVar6 = gles31::Context::getRenderContext
                     ((this->super_IdentityShaderCase).super_TestCase.m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  tcu::Surface::Surface((Surface *)&resultWithoutGeometry.m_pixels.m_cap,0x80,0x80);
  tcu::Surface::Surface((Surface *)local_50,0x80,0x80);
  local_e8 = "RenderWithGeometryShader";
  renderTargets[0].name = "Render with geometry shader";
  renderTargets[0].description._0_1_ = 1;
  tcu::Surface::getAccess
            ((PixelBufferAccess *)&renderTargets[0].containsGeometryShader,
             (Surface *)&resultWithoutGeometry.m_pixels.m_cap);
  renderTargets[0].surfaceAccess.super_ConstPixelBufferAccess.m_data = anon_var_dwarf_1c43148;
  renderTargets[1].name = "Render without geometry shader";
  renderTargets[1].description._0_1_ = 0;
  tcu::Surface::getAccess
            ((PixelBufferAccess *)&renderTargets[1].containsGeometryShader,(Surface *)local_50);
  (**(code **)(lVar7 + 0x1a00))(0,0,0x80);
  (**(code **)(lVar7 + 0x1c0))(0,0,0,0x3f800000);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"set viewport",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xf6);
  (**(code **)(lVar7 + 0x5e0))(0xbe2);
  (**(code **)(lVar7 + 0x120))(0x302,1);
  (**(code **)(lVar7 + 0x100))(0x8006);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"set blend",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xfb);
  pTVar8 = tcu::TestContext::getLog
                     ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_268,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_268,(char (*) [27])"Tessellation level: inner ");
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(float *)((long)&gl + 4));
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [9])", outer ");
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(float *)&gl);
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_268);
  section.m_log._4_4_ = 0;
  while( true ) {
    if (1 < section.m_log._4_4_) {
      pTVar8 = tcu::TestContext::getLog
                         ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
      tcu::Surface::getAccess((PixelBufferAccess *)&local_698,(Surface *)local_50);
      tcu::Surface::getAccess
                ((PixelBufferAccess *)&local_6c0,(Surface *)&resultWithoutGeometry.m_pixels.m_cap);
      tcu::Vector<unsigned_int,_4>::Vector(&local_6d0,8,8,8,0xff);
      tcu::Vector<int,_3>::Vector(&local_6dc,1,1,0);
      bVar3 = tcu::intThresholdPositionDeviationCompare
                        (pTVar8,"ImageCompare","Image comparison",&local_698,&local_6c0,&local_6d0,
                         &local_6dc,true,COMPARE_LOG_RESULT);
      if (bVar3) {
        tcu::TestContext::setTestResult
                  ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_PASS,"Pass");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Image comparison failed");
      }
      tcu::Surface::~Surface((Surface *)local_50);
      tcu::Surface::~Surface((Surface *)&resultWithoutGeometry.m_pixels.m_cap);
      return STOP;
    }
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    pcVar1 = (char *)renderTargets[(long)section.m_log._4_4_ + -1].surfaceAccess.
                     super_ConstPixelBufferAccess.m_data;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,pcVar1,&local_299);
    pcVar1 = renderTargets[section.m_log._4_4_].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,pcVar1,(allocator<char> *)&sources.field_0xcf);
    tcu::ScopedLogSection::ScopedLogSection(&local_278,pTVar8,&local_298,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator((allocator<char> *)&sources.field_0xcf);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator(&local_299);
    glu::ProgramSources::ProgramSources((ProgramSources *)local_398);
    Functional::(anonymous_namespace)::IdentityShaderCase::getVertexSource_abi_cxx11_
              (&local_3e0,this);
    glu::VertexSource::VertexSource((VertexSource *)&local_3c0,&local_3e0);
    pPVar10 = glu::ProgramSources::operator<<((ProgramSources *)local_398,&local_3c0);
    Functional::(anonymous_namespace)::IdentityShaderCase::getFragmentSource_abi_cxx11_
              (&local_428,this);
    glu::FragmentSource::FragmentSource((FragmentSource *)&local_408,&local_428);
    pPVar10 = glu::ProgramSources::operator<<(pPVar10,&local_408);
    Functional::(anonymous_namespace)::IdentityGeometryShaderCase::
    getTessellationControlSource_abi_cxx11_(&local_470,this);
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)&local_450,&local_470);
    pPVar10 = glu::ProgramSources::operator<<(pPVar10,&local_450);
    Functional::(anonymous_namespace)::IdentityGeometryShaderCase::
    getTessellationEvaluationSource_abi_cxx11_
              (&local_4b8,this,(bool)(*(byte *)&renderTargets[section.m_log._4_4_].description & 1))
    ;
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_498,&local_4b8);
    glu::ProgramSources::operator<<(pPVar10,&local_498);
    glu::TessellationEvaluationSource::~TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_498);
    std::__cxx11::string::~string((string *)&local_4b8);
    glu::TessellationControlSource::~TessellationControlSource
              ((TessellationControlSource *)&local_450);
    std::__cxx11::string::~string((string *)&local_470);
    glu::FragmentSource::~FragmentSource((FragmentSource *)&local_408);
    std::__cxx11::string::~string((string *)&local_428);
    glu::VertexSource::~VertexSource((VertexSource *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3e0);
    if (((ulong)renderTargets[section.m_log._4_4_].description & 1) != 0) {
      Functional::(anonymous_namespace)::IdentityGeometryShaderCase::getGeometrySource_abi_cxx11_
                ((string *)&program.m_program.m_info.linkTimeUs,this);
      glu::GeometrySource::GeometrySource
                ((GeometrySource *)&local_4e0,(string *)&program.m_program.m_info.linkTimeUs);
      glu::ProgramSources::operator<<((ProgramSources *)local_398,&local_4e0);
      glu::GeometrySource::~GeometrySource((GeometrySource *)&local_4e0);
      std::__cxx11::string::~string((string *)&program.m_program.m_info.linkTimeUs);
    }
    pRVar6 = gles31::Context::getRenderContext
                       ((this->super_IdentityShaderCase).super_TestCase.m_context);
    glu::ShaderProgram::ShaderProgram
              ((ShaderProgram *)&vao.super_ObjectWrapper.m_object,pRVar6,(ProgramSources *)local_398
              );
    pRVar6 = gles31::Context::getRenderContext
                       ((this->super_IdentityShaderCase).super_TestCase.m_context);
    glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)5> *)&innerTessellationLoc,pRVar6);
    pcVar2 = *(code **)(lVar7 + 0x780);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)&vao.super_ObjectWrapper.m_object);
    outerTessellationLoc = (*pcVar2)(dVar5,"a_position");
    pcVar2 = *(code **)(lVar7 + 0xb48);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)&vao.super_ObjectWrapper.m_object);
    local_5f0 = (*pcVar2)(dVar5,"u_innerTessellationLevel");
    pcVar2 = *(code **)(lVar7 + 0xb48);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)&vao.super_ObjectWrapper.m_object);
    local_5f4 = (*pcVar2)(dVar5,"u_outerTessellationLevel");
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_IdentityShaderCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    glu::operator<<(pTVar8,(ShaderProgram *)&vao.super_ObjectWrapper.m_object);
    bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)&vao.super_ObjectWrapper.m_object);
    if (!bVar3) {
      local_61a = 1;
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_618,"could not build program",&local_619);
      tcu::TestError::TestError(pTVar11,&local_618);
      local_61a = 0;
      __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if (outerTessellationLoc == -1) {
      local_642 = 1;
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_640,"a_position location was -1",&local_641);
      tcu::TestError::TestError(pTVar11,&local_640);
      local_642 = 0;
      __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if (local_5f4 == -1) break;
    pcVar2 = *(code **)(lVar7 + 0xd8);
    dVar5 = glu::ObjectWrapper::operator*((ObjectWrapper *)&innerTessellationLoc);
    (*pcVar2)(dVar5);
    (**(code **)(lVar7 + 0x40))(0x8892,this->m_patchBuffer);
    (**(code **)(lVar7 + 0x19f0))(outerTessellationLoc,4,0x1406,0,0,0);
    (**(code **)(lVar7 + 0x610))(outerTessellationLoc);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"setup attribs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x121);
    pcVar2 = *(code **)(lVar7 + 0x1680);
    dVar5 = glu::ShaderProgram::getProgram((ShaderProgram *)&vao.super_ObjectWrapper.m_object);
    (*pcVar2)(dVar5);
    (**(code **)(lVar7 + 0x14e0))(0x41600000,local_5f4);
    if (local_5f0 == -1) {
      (**(code **)(lVar7 + 0x14e0))(0x41600000,0xffffffff);
    }
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"use program",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x129);
    (**(code **)(lVar7 + 0xfd8))(0x8e72,4 - (uint)(this->m_case == CASE_TRIANGLES));
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"set patch param",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,300);
    (**(code **)(lVar7 + 0x188))(0x4000);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"clear",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x12f);
    (**(code **)(lVar7 + 0x538))(0xe,0,4);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"draw patches",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                    ,0x132);
    pRVar6 = gles31::Context::getRenderContext
                       ((this->super_IdentityShaderCase).super_TestCase.m_context);
    glu::readPixels(pRVar6,0,0,
                    (PixelBufferAccess *)&renderTargets[section.m_log._4_4_].containsGeometryShader)
    ;
    glu::TypedObjectWrapper<(glu::ObjectType)5>::~TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)5> *)&innerTessellationLoc);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&vao.super_ObjectWrapper.m_object);
    glu::ProgramSources::~ProgramSources((ProgramSources *)local_398);
    tcu::ScopedLogSection::~ScopedLogSection(&local_278);
    section.m_log._4_4_ = section.m_log._4_4_ + 1;
  }
  local_66a = 1;
  pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_668,"u_outerTessellationLevel location was -1",&local_669);
  tcu::TestError::TestError(pTVar11,&local_668);
  local_66a = 0;
  __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

IdentityGeometryShaderCase::IterateResult IdentityGeometryShaderCase::iterate (void)
{
	const float				innerTessellationLevel	= 14.0f;
	const float				outerTessellationLevel	= 14.0f;
	const glw::Functions&	gl						= m_context.getRenderContext().getFunctions();
	tcu::Surface			resultWithGeometry		(RENDER_SIZE, RENDER_SIZE);
	tcu::Surface			resultWithoutGeometry	(RENDER_SIZE, RENDER_SIZE);

	const struct
	{
		const char*				name;
		const char*				description;
		bool					containsGeometryShader;
		tcu::PixelBufferAccess	surfaceAccess;
	} renderTargets[] =
	{
		{ "RenderWithGeometryShader",		"Render with geometry shader",		true,	resultWithGeometry.getAccess()		},
		{ "RenderWithoutGeometryShader",	"Render without geometry shader",	false,	resultWithoutGeometry.getAccess()	},
	};

	gl.viewport(0, 0, RENDER_SIZE, RENDER_SIZE);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "set viewport");

	gl.enable(GL_BLEND);
	gl.blendFunc(GL_SRC_ALPHA, GL_ONE);
	gl.blendEquation(GL_FUNC_ADD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "set blend");

	m_testCtx.getLog() << tcu::TestLog::Message << "Tessellation level: inner " << innerTessellationLevel << ", outer " << outerTessellationLevel << tcu::TestLog::EndMessage;

	// render with and without geometry shader
	for (int renderNdx = 0; renderNdx < DE_LENGTH_OF_ARRAY(renderTargets); ++renderNdx)
	{
		const tcu::ScopedLogSection	section	(m_testCtx.getLog(), renderTargets[renderNdx].name, renderTargets[renderNdx].description);
		glu::ProgramSources			sources;

		sources	<< glu::VertexSource(getVertexSource())
				<< glu::FragmentSource(getFragmentSource())
				<< glu::TessellationControlSource(getTessellationControlSource())
				<< glu::TessellationEvaluationSource(getTessellationEvaluationSource(renderTargets[renderNdx].containsGeometryShader));

		if (renderTargets[renderNdx].containsGeometryShader)
			sources << glu::GeometrySource(getGeometrySource());

		{
			const glu::ShaderProgram	program					(m_context.getRenderContext(), sources);
			const glu::VertexArray		vao						(m_context.getRenderContext());
			const int					posLocation				= gl.getAttribLocation(program.getProgram(), "a_position");
			const int					innerTessellationLoc	= gl.getUniformLocation(program.getProgram(), "u_innerTessellationLevel");
			const int					outerTessellationLoc	= gl.getUniformLocation(program.getProgram(), "u_outerTessellationLevel");

			m_testCtx.getLog() << program;

			if (!program.isOk())
				throw tcu::TestError("could not build program");
			if (posLocation == -1)
				throw tcu::TestError("a_position location was -1");
			if (outerTessellationLoc == -1)
				throw tcu::TestError("u_outerTessellationLevel location was -1");

			gl.bindVertexArray(*vao);
			gl.bindBuffer(GL_ARRAY_BUFFER, m_patchBuffer);
			gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
			gl.enableVertexAttribArray(posLocation);
			GLU_EXPECT_NO_ERROR(gl.getError(), "setup attribs");

			gl.useProgram(program.getProgram());
			gl.uniform1f(outerTessellationLoc, outerTessellationLevel);

			if (innerTessellationLoc == -1)
				gl.uniform1f(innerTessellationLoc, innerTessellationLevel);

			GLU_EXPECT_NO_ERROR(gl.getError(), "use program");

			gl.patchParameteri(GL_PATCH_VERTICES, (m_case == CASE_TRIANGLES) ? (3): (4));
			GLU_EXPECT_NO_ERROR(gl.getError(), "set patch param");

			gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

			gl.drawArrays(GL_PATCHES, 0, 4);
			GLU_EXPECT_NO_ERROR(gl.getError(), "draw patches");

			glu::readPixels(m_context.getRenderContext(), 0, 0, renderTargets[renderNdx].surfaceAccess);
		}
	}

	if (tcu::intThresholdPositionDeviationCompare(m_testCtx.getLog(),
												  "ImageCompare",
												  "Image comparison",
												  resultWithoutGeometry.getAccess(),
												  resultWithGeometry.getAccess(),
												  tcu::UVec4(8, 8, 8, 255),
												  tcu::IVec3(1, 1, 0),
												  true,
												  tcu::COMPARE_LOG_RESULT))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	return STOP;
}